

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O2

optional<tinyusdz::value::TimeSamples> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::value::TimeSamples>
          (optional<tinyusdz::value::TimeSamples> *__return_storage_ptr__,CrateValue *this)

{
  optional<tinyusdz::value::TimeSamples> oStack_38;
  
  tinyusdz::value::Value::get_value<tinyusdz::value::TimeSamples>(&oStack_38,&this->value_,false);
  nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::
  optional<tinyusdz::value::TimeSamples,_0>(__return_storage_ptr__,&oStack_38);
  nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::~optional(&oStack_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }